

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O0

iter_type __thiscall
booster::locale::util::base_num_parse<wchar_t>::parse_currency<true>
          (base_num_parse<wchar_t> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,
          longdouble *val)

{
  _Ios_Iostate _Var1;
  money_get *pmVar2;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined4 in_R8D;
  undefined8 in_R9;
  iter_type iVar3;
  _Ios_Iostate *in_stack_00000008;
  longdouble *in_stack_00000010;
  longdouble rval;
  int digits;
  locale loc;
  ios_base *in_stack_fffffffffffffef8;
  longdouble local_78 [2];
  int local_54;
  locale local_50;
  undefined8 local_48;
  undefined8 local_38;
  undefined4 uStack_30;
  undefined1 local_28 [12];
  undefined1 local_18 [12];
  
  local_48 = in_R9;
  local_38 = in_RCX;
  uStack_30 = in_R8D;
  local_28._0_8_ = in_RSI;
  local_28._8_4_ = in_EDX;
  std::ios_base::getloc(in_stack_fffffffffffffef8);
  std::use_facet<std::__cxx11::moneypunct<wchar_t,true>>(&local_50);
  local_54 = std::__cxx11::moneypunct<wchar_t,true>::frac_digits();
  pmVar2 = std::
           use_facet<std::__cxx11::money_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     (&local_50);
  local_28 = std::__cxx11::
             money_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::get
                       (pmVar2,local_28._0_8_,local_28._8_4_,local_38,uStack_30,1,local_48,
                        in_stack_00000008,local_78);
  _Var1 = std::operator&(*in_stack_00000008,_S_failbit);
  if (_Var1 == _S_goodbit) {
    for (; 0 < local_54; local_54 = local_54 + -1) {
      local_78[0] = local_78[0] / (longdouble)10.0;
    }
    *in_stack_00000010 = local_78[0];
  }
  local_18 = local_28;
  std::locale::~locale(&local_50);
  iVar3._12_4_ = 0;
  iVar3._M_sbuf = (streambuf_type *)local_18._0_8_;
  iVar3._M_c = local_18._8_4_;
  return iVar3;
}

Assistant:

iter_type parse_currency(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,long double &val) const
    {
        std::locale loc = ios.getloc();
        int digits = std::use_facet<std::moneypunct<char_type,intl> >(loc).frac_digits();
        long double rval;
        in = std::use_facet<std::money_get<char_type> >(loc).get(in,end,intl,ios,err,rval);
        if(!(err & std::ios::failbit)) {
            while(digits > 0) {
                rval/=10;
                digits --;
            }
            val = rval;
        }
        return in;
    }